

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

int Vec_IntPushUniqueLocal(Vec_Int_t *p,int Entry)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nSize;
  if (p->nSize < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      Vec_IntPush(p,Entry);
      return 0;
    }
    piVar1 = p->pArray + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 != Entry);
  return 1;
}

Assistant:

int Vec_IntPushUniqueLocal( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPush( p, Entry );
    return 0;
}